

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

bool __thiscall
cmGeneratorTarget::ComputeCompileFeatures
          (cmGeneratorTarget *this,string *config,
          set<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *languagePairs)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *this_00;
  cmMakefile *this_01;
  pointer pcVar1;
  int iVar2;
  BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *pBVar3;
  mapped_type *pmVar4;
  cmValue cVar5;
  _Base_ptr p_Var6;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  string key;
  BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_130;
  char *local_f8;
  undefined8 local_f0;
  string local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  string local_a8;
  undefined1 local_88 [64];
  cmConstStack<cmListFileContext,_cmListFileBacktrace> local_48;
  _Rb_tree_node_base *local_38;
  
  p_Var6 = (languagePairs->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  local_38 = &(languagePairs->_M_t)._M_impl.super__Rb_tree_header._M_header;
  if (p_Var6 != local_38) {
    this_00 = &this->LanguageStandardMap;
    do {
      pBVar3 = GetLanguageStandardProperty(this,(string *)(p_Var6 + 1),config);
      if (pBVar3 == (BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)0x0) {
        cmsys::SystemTools::UpperCase(&local_a8,config);
        local_130.Value._M_dataplus._M_p = (pointer)local_a8._M_string_length;
        local_130.Value._M_string_length = (size_type)local_a8._M_dataplus._M_p;
        local_88._0_8_ = (pointer)0x0;
        local_88._8_8_ = (pointer)0x1;
        local_130.Backtraces.
        super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)(local_88 + 0x18);
        local_88[0x18] = '-';
        local_130.Value.field_2._8_8_ = (_Base_ptr)0x1;
        local_130.Backtraces.
        super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_f8 = *(char **)(p_Var6 + 1);
        local_130.Backtraces.
        super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)p_Var6[1]._M_parent;
        local_f0 = 0;
        views._M_len = 3;
        views._M_array = (iterator)&local_130;
        local_130.Value.field_2._M_allocated_capacity = (size_type)&local_a8;
        local_88._16_8_ =
             local_130.Backtraces.
             super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>._M_impl.
             super__Vector_impl_data._M_start;
        cmCatViews(&local_e8,views);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
        }
        pBVar3 = GetLanguageStandardProperty(this,(string *)(p_Var6 + 2),config);
        if (pBVar3 == (BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)0x0) {
          this_01 = this->Makefile;
          local_130.Value._M_dataplus._M_p = (pointer)0x6;
          local_130.Value._M_string_length = 0x89e658;
          local_130.Value.field_2._M_allocated_capacity = 0;
          local_130.Backtraces.
          super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>._M_impl.
          super__Vector_impl_data._M_start = *(pointer *)(p_Var6 + 2);
          local_130.Value.field_2._8_8_ = p_Var6[2]._M_parent;
          local_130.Backtraces.
          super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_130.Backtraces.
          super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)&DAT_00000011;
          local_f8 = "_STANDARD_DEFAULT";
          local_f0 = 0;
          views_00._M_len = 3;
          views_00._M_array = (iterator)&local_130;
          cmCatViews((string *)local_88,views_00);
          cVar5 = cmMakefile::GetDefinition(this_01,(string *)local_88);
          if ((pointer)local_88._0_8_ != (pointer)(local_88 + 0x10)) {
            operator_delete((void *)local_88._0_8_,(ulong)(local_88._16_8_ + 1));
          }
          if (cVar5.Value != (string *)0x0) {
            local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
            pcVar1 = ((cVar5.Value)->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_c8,pcVar1,pcVar1 + (cVar5.Value)->_M_string_length);
            local_48.TopEntry.
            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = (element_type *)0x0;
            local_48.TopEntry.
            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack(&local_48);
            BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
            BTs(&local_130,&local_c8,(cmListFileBacktrace *)&local_48);
            pmVar4 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     ::operator[](this_00,&local_e8);
            std::__cxx11::string::operator=((string *)pmVar4,(string *)&local_130);
            local_88._16_8_ =
                 (pmVar4->Backtraces).
                 super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
            local_88._0_8_ =
                 (pmVar4->Backtraces).
                 super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>.
                 _M_impl.super__Vector_impl_data._M_start;
            local_88._8_8_ =
                 (pmVar4->Backtraces).
                 super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
            (pmVar4->Backtraces).
            super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>._M_impl.
            super__Vector_impl_data._M_start =
                 local_130.Backtraces.
                 super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>.
                 _M_impl.super__Vector_impl_data._M_start;
            (pmVar4->Backtraces).
            super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_130.Backtraces.
                 super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
            (pmVar4->Backtraces).
            super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 local_130.Backtraces.
                 super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
            local_130.Backtraces.
            super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_130.Backtraces.
            super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_130.Backtraces.
            super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::~vector
                      ((vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_> *)local_88
                      );
            std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::~vector
                      (&local_130.Backtraces);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_130.Value._M_dataplus._M_p != &local_130.Value.field_2) {
              operator_delete(local_130.Value._M_dataplus._M_p,
                              (ulong)(local_130.Value.field_2._M_allocated_capacity + 1));
            }
            if (local_48.TopEntry.
                super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_48.TopEntry.
                         super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
              operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
            }
            pmVar4 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     ::operator[](this_00,&local_e8);
            goto LAB_0058e349;
          }
        }
        else {
          pmVar4 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ::operator[](this_00,&local_e8);
          std::__cxx11::string::_M_assign((string *)pmVar4);
          std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::operator=
                    (&pmVar4->Backtraces,&pBVar3->Backtraces);
          pmVar4 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ::operator[](this_00,&local_e8);
LAB_0058e349:
          iVar2 = std::__cxx11::string::compare((char *)(p_Var6 + 1));
          if (iVar2 == 0) {
            iVar2 = std::__cxx11::string::compare((char *)pmVar4);
            if (iVar2 == 0) {
              pmVar4 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       ::operator[](this_00,&local_e8);
              std::__cxx11::string::_M_replace
                        ((ulong)pmVar4,0,(char *)(pmVar4->Value)._M_string_length,0x8997f8);
            }
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
        }
      }
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
    } while (p_Var6 != local_38);
  }
  return true;
}

Assistant:

const char* cmGeneratorTarget::GetCustomObjectExtension() const
{
  struct compiler_mode
  {
    std::string variable;
    std::string extension;
  };
  static std::array<compiler_mode, 4> const modes{
    { { "CUDA_PTX_COMPILATION", ".ptx" },
      { "CUDA_CUBIN_COMPILATION", ".cubin" },
      { "CUDA_FATBIN_COMPILATION", ".fatbin" },
      { "CUDA_OPTIX_COMPILATION", ".optixir" } }
  };

  std::string const& compiler =
    this->Makefile->GetSafeDefinition("CMAKE_CUDA_COMPILER_ID");
  if (!compiler.empty()) {
    for (const auto& m : modes) {
      const bool has_extension = this->GetPropertyAsBool(m.variable);
      if (has_extension) {
        return m.extension.c_str();
      }
    }
  }
  return nullptr;
}